

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

Polynom<Complex> __thiscall Polynom<Complex>::operator*(Polynom<Complex> *this,Polynom<Complex> *a)

{
  uint uVar1;
  Complex *this_00;
  Matrix<Complex> *in_RDX;
  Complex *extraout_RDX;
  Matrix<Complex> *in_RSI;
  Matrix<Complex> *in_RDI;
  Polynom<Complex> PVar2;
  uint j;
  uint i;
  Polynom<Complex> *temp;
  undefined4 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  Polynom<Complex> *in_stack_fffffffffffffec0;
  crow_t in_stack_ffffffffffffff00;
  MatrixRow<Complex_&> local_c8;
  MatrixRow<const_Complex_&> local_c0;
  MatrixRow<const_Complex_&> local_b8 [3];
  Complex *in_stack_ffffffffffffff60;
  Complex *in_stack_ffffffffffffff68;
  uint local_30;
  uint local_20;
  
  Matrix<Complex>::width(in_RSI);
  Matrix<Complex>::width(in_RDX);
  Polynom(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  for (local_20 = 0; uVar1 = Matrix<Complex>::width(in_RSI), local_20 < uVar1;
      local_20 = local_20 + 1) {
    for (local_30 = 0; uVar1 = Matrix<Complex>::width(in_RDX), local_30 < uVar1;
        local_30 = local_30 + 1) {
      in_stack_ffffffffffffff00 =
           Matrix<Complex>::operator[]
                     ((Matrix<Complex> *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
      local_b8[0].arr = in_stack_ffffffffffffff00.arr;
      uVar1 = Matrix<Complex>::width(in_RSI);
      Matrix<Complex>::MatrixRow<const_Complex_&>::operator[](local_b8,~local_20 + uVar1);
      local_c0.arr = (Complex *)
                     Matrix<Complex>::operator[]
                               ((Matrix<Complex> *)
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
      uVar1 = Matrix<Complex>::width(in_RDX);
      Matrix<Complex>::MatrixRow<const_Complex_&>::operator[](&local_c0,~local_30 + uVar1);
      ::operator*(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      local_c8.arr = (Complex *)
                     Matrix<Complex>::operator[]
                               ((Matrix<Complex> *)
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
      uVar1 = Matrix<Complex>::width(in_RDI);
      this_00 = Matrix<Complex>::MatrixRow<Complex_&>::operator[]
                          (&local_c8,(~local_20 + uVar1) - local_30);
      Complex::operator+=(this_00,(Complex *)
                                  CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      Complex::~Complex(this_00);
    }
  }
  strip((Polynom<Complex> *)in_stack_ffffffffffffff00.arr);
  PVar2.m.arr = extraout_RDX;
  PVar2.m._0_8_ = in_RDI;
  return (Polynom<Complex>)PVar2.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::operator*(const Polynom &a) const
{
    Polynom temp(m.width() + a.m.width() - 1);
    for(unsigned i = 0; i < m.width(); ++i)
    {
        for(unsigned j = 0; j < a.m.width(); ++j)
        {
            temp.m[0][temp.m.width() - 1 - i - j] += m[0][m.width() - 1 - i] * a.m[0][a.m.width() - 1 - j];
        }
    }
    temp.strip();
    return temp;
}